

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var>::
     init_holder<kratos::Var>
               (instance *inst,value_and_holder *v_h,holder_type *param_3,
               enable_shared_from_this<kratos::Var> *param_4)

{
  bool bVar1;
  Port **ppPVar2;
  shared_ptr<kratos::Port> *psVar3;
  enable_shared_from_this<kratos::Var> *local_60;
  shared_ptr<kratos::Var> local_48;
  undefined1 local_38 [8];
  shared_ptr<kratos::Port> sh;
  enable_shared_from_this<kratos::Var> *param_3_local;
  holder_type *param_2_local;
  value_and_holder *v_h_local;
  instance *inst_local;
  
  sh.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)param_4;
  ppPVar2 = pybind11::detail::value_and_holder::value_ptr<kratos::Port>(v_h);
  local_60 = (enable_shared_from_this<kratos::Var> *)0x0;
  if (*ppPVar2 != (Port *)0x0) {
    local_60 = &((*ppPVar2)->super_Var).super_enable_shared_from_this<kratos::Var>;
  }
  pybind11::detail::try_get_shared_from_this<kratos::Var>((detail *)&local_48,local_60);
  std::dynamic_pointer_cast<kratos::Port,kratos::Var>((shared_ptr<kratos::Var> *)local_38);
  std::shared_ptr<kratos::Var>::~shared_ptr(&local_48);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (bVar1) {
    psVar3 = pybind11::detail::value_and_holder::holder<std::shared_ptr<kratos::Port>>(v_h);
    std::shared_ptr<kratos::Port>::shared_ptr(psVar3,(shared_ptr<kratos::Port> *)local_38);
    pybind11::detail::value_and_holder::set_holder_constructed(v_h,true);
  }
  bVar1 = pybind11::detail::value_and_holder::holder_constructed(v_h);
  if ((!bVar1) && ((inst->field_0x30 & 1) != 0)) {
    psVar3 = pybind11::detail::value_and_holder::holder<std::shared_ptr<kratos::Port>>(v_h);
    ppPVar2 = pybind11::detail::value_and_holder::value_ptr<kratos::Port>(v_h);
    std::shared_ptr<kratos::Port>::shared_ptr<kratos::Port,void>(psVar3,*ppPVar2);
    pybind11::detail::value_and_holder::set_holder_constructed(v_h,true);
  }
  std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_38);
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type * /* unused */, const std::enable_shared_from_this<T> * /* dummy */) {

        auto sh = std::dynamic_pointer_cast<typename holder_type::element_type>(
                detail::try_get_shared_from_this(v_h.value_ptr<type>()));
        if (sh) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(std::move(sh));
            v_h.set_holder_constructed();
        }

        if (!v_h.holder_constructed() && inst->owned) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }